

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

void session_set_state(SESSION_INSTANCE *session_instance,SESSION_STATE session_state)

{
  LINK_ENDPOINT_INSTANCE *pLVar1;
  ulong uVar2;
  
  session_instance->previous_session_state = session_instance->session_state;
  session_instance->session_state = session_state;
  for (uVar2 = 0; uVar2 < session_instance->link_endpoint_count; uVar2 = uVar2 + 1) {
    pLVar1 = session_instance->link_endpoints[uVar2];
    if ((pLVar1->on_session_state_changed != (ON_SESSION_STATE_CHANGED)0x0) &&
       (pLVar1->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)) {
      (*pLVar1->on_session_state_changed)
                (pLVar1->callback_context,session_state,session_instance->previous_session_state);
    }
  }
  return;
}

Assistant:

static void session_set_state(SESSION_INSTANCE* session_instance, SESSION_STATE session_state)
{
    uint32_t i;

    session_instance->previous_session_state = session_instance->session_state;
    session_instance->session_state = session_state;

    for (i = 0; i < session_instance->link_endpoint_count; i++)
    {
        if (session_instance->link_endpoints[i]->on_session_state_changed != NULL)
        {
            if (session_instance->link_endpoints[i]->link_endpoint_state != LINK_ENDPOINT_STATE_DETACHING)
            {
                session_instance->link_endpoints[i]->on_session_state_changed(session_instance->link_endpoints[i]->callback_context, session_state, session_instance->previous_session_state);
            }
        }
    }
}